

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascii-cursor.c
# Opt level: O1

int coda_ascii_cursor_read_float_array
              (coda_cursor_conflict *cursor,float *dst,coda_array_ordering array_ordering)

{
  int iVar1;
  coda_type *pcVar2;
  coda_array_ordering in_R8D;
  int iVar3;
  
  pcVar2 = (coda_type *)cursor->stack[(long)cursor->n + -1].type;
  if (99 < pcVar2->format) {
    pcVar2 = *(coda_type **)&pcVar2->type_class;
  }
  if ((*(coda_type **)(pcVar2 + 1))->format == coda_format_ascii) {
    iVar1 = read_array(cursor,coda_ascii_cursor_read_float,(uint8_t *)dst,4,in_R8D);
    iVar3 = -1;
    if (iVar1 == 0) {
      if ((array_ordering != coda_array_ordering_c) &&
         (iVar1 = transpose_array(cursor,dst,4), iVar1 != 0)) {
        return -1;
      }
      iVar3 = 0;
    }
    return iVar3;
  }
  __assert_fail("type->base_type->format == coda_format_ascii",
                "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascii-cursor.c"
                ,0x661,
                "int coda_ascii_cursor_read_float_array(const coda_cursor *, float *, coda_array_ordering)"
               );
}

Assistant:

int coda_ascii_cursor_read_float_array(const coda_cursor *cursor, float *dst, coda_array_ordering array_ordering)
{
    coda_type_array *type = (coda_type_array *)coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);

    assert(type->base_type->format == coda_format_ascii);
    if (read_array(cursor, (read_function)&coda_ascii_cursor_read_float, (uint8_t *)dst, sizeof(float),
                   coda_array_ordering_c) != 0)
    {
        return -1;
    }
    if (array_ordering != coda_array_ordering_c)
    {
        if (transpose_array(cursor, dst, sizeof(float)) != 0)
        {
            return -1;
        }
    }
    return 0;
}